

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O3

void __thiscall
cfd::core::ConfidentialTransaction::SetElementsTxState(ConfidentialTransaction *this)

{
  void *pvVar1;
  ulong uVar2;
  int iVar3;
  byte *pbVar4;
  uint uVar5;
  byte bVar6;
  ulong uVar7;
  size_t is_coinbase;
  
  pvVar1 = (this->super_AbstractTransaction).wally_tx_pointer_;
  if (((pvVar1 != (void *)0x0) && (iVar3 = wally_tx_is_coinbase(pvVar1), iVar3 == 0)) &&
     (uVar2 = *(ulong *)((long)pvVar1 + 0x10), uVar2 != 0)) {
    pbVar4 = (byte *)(*(long *)((long)pvVar1 + 8) + 0x40);
    uVar5 = 1;
    do {
      if ((*(long *)(pbVar4 + 0x88) == 0) || (*(long *)(*(long *)(pbVar4 + 0x88) + 8) == 0)) {
        bVar6 = *pbVar4 & 0xfb;
      }
      else {
        bVar6 = *pbVar4 | 4;
      }
      if (((*(long *)(pbVar4 + 0x48) == 0) || (*(long *)(pbVar4 + 0x50) == 0)) &&
         ((*(long *)(pbVar4 + 0x58) == 0 || (*(long *)(pbVar4 + 0x60) == 0)))) {
        bVar6 = bVar6 & 0xfd;
      }
      else {
        bVar6 = bVar6 | 2;
      }
      *pbVar4 = bVar6;
      uVar7 = (ulong)uVar5;
      pbVar4 = pbVar4 + 0xd0;
      uVar5 = uVar5 + 1;
    } while (uVar7 < uVar2);
  }
  return;
}

Assistant:

void ConfidentialTransaction::SetElementsTxState() {
  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  if (tx_pointer != nullptr) {
    size_t is_coinbase = 0;
    // coinbase priority when coinbase is set
    int ret = wally_tx_is_coinbase(tx_pointer, &is_coinbase);
    if ((ret == WALLY_OK) && (is_coinbase == 0)) {
      for (uint32_t i = 0; i < tx_pointer->num_inputs; ++i) {
        struct wally_tx_input *input = tx_pointer->inputs + i;
        // pegin_witness
        if ((input->pegin_witness != nullptr) &&
            (input->pegin_witness->num_items != 0)) {
          input->features |= kTxInFeaturePegin;
        } else {
          input->features &= ~kTxInFeaturePegin;
        }

        // issuance
        if (((input->issuance_amount != nullptr) &&
             (input->issuance_amount_len != 0)) ||
            ((input->inflation_keys != nullptr) &&
             (input->inflation_keys_len != 0))) {
          input->features |= kTxInFeatureIssuance;
        } else {
          input->features &= ~kTxInFeatureIssuance;
        }
      }
    }
  }
}